

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

bool bloaty::anon_unknown_0::ReadElfArchMode(InputFile *file,cs_arch *arch,cs_mode *mode)

{
  ulong uVar1;
  long *plVar2;
  byte bVar3;
  string_view data;
  bool bVar4;
  bool bVar5;
  cs_arch cVar6;
  Arg *in_R8;
  string_view data_00;
  string_view format;
  MemberReader reader;
  MemberFile member;
  ElfFile elf;
  string local_198;
  MemberFile local_170;
  ElfFile local_130;
  
  uVar1 = (file->data_)._M_len;
  if (uVar1 < 8) {
    Throw("region out-of-bounds",0x5d);
  }
  plVar2 = (long *)(file->data_)._M_str;
  if (*plVar2 == 0xa3e686372613c21) {
    local_198.field_2._8_8_ = plVar2 + 1;
    local_198.field_2._M_allocated_capacity = uVar1 - 8;
    local_170.filename._M_len = 0;
    local_170.filename._M_str = (char *)0x0;
    local_170.header._M_len = 0;
    local_170.header._M_str = (char *)0x0;
    local_170.contents._M_len = 0;
    local_170.contents._M_str = (char *)0x0;
    local_198._M_dataplus._M_p = (pointer)0x0;
    local_198._M_string_length = 0;
    bVar4 = ArFile::MemberReader::ReadMember((MemberReader *)&local_198,&local_170);
    if (!bVar4) {
      return true;
    }
    bVar4 = true;
    do {
      if ((local_170.file_type == kNormal) &&
         (data._M_str = local_170.contents._M_str, data._M_len = local_170.contents._M_len,
         ElfFile::ElfFile(&local_130,data), local_130.ok_ == true)) {
        if (local_130.header_.e_machine < 0x15) {
          if (local_130.header_.e_machine < 8) {
            if (local_130.header_.e_machine == 2) {
              *arch = CS_ARCH_SPARC;
              *mode = CS_MODE_BIG_ENDIAN;
            }
            else {
              if (local_130.header_.e_machine != 3) goto LAB_001877e2;
              *arch = CS_ARCH_X86;
              *mode = CS_MODE_32;
            }
            goto LAB_001877b8;
          }
          if (local_130.header_.e_machine == 8) {
            *arch = CS_ARCH_MIPS;
            goto LAB_001877b8;
          }
          if (local_130.header_.e_machine == 0x14) {
            cVar6 = CS_ARCH_PPC;
            goto LAB_00187774;
          }
LAB_001877e2:
          if (verbose_level < 2) {
            bVar3 = 0;
          }
          else {
            bVar3 = 0;
            printf("Unable to map to capstone target, disassembly will be unavailable");
          }
        }
        else {
          if (local_130.header_.e_machine < 0x2b) {
            if (local_130.header_.e_machine == 0x15) {
              *arch = CS_ARCH_PPC;
LAB_001877b2:
              *mode = CS_MODE_64;
            }
            else {
              if (local_130.header_.e_machine != 0x28) goto LAB_001877e2;
              cVar6 = CS_ARCH_ARM;
LAB_00187774:
              *arch = cVar6;
              *mode = cVar6;
            }
          }
          else if (local_130.header_.e_machine == 0x2b) {
            *arch = CS_ARCH_SPARC;
            *mode = CS_MODE_M680X_6801;
          }
          else {
            if (local_130.header_.e_machine == 0x3e) {
              *arch = CS_ARCH_X86;
              goto LAB_001877b2;
            }
            if (local_130.header_.e_machine != 0xb7) goto LAB_001877e2;
            *arch = CS_ARCH_ARM64;
            *mode = CS_MODE_ARM;
          }
LAB_001877b8:
          bVar3 = 1;
        }
        bVar4 = (bool)(bVar4 & bVar3);
      }
      bVar5 = ArFile::MemberReader::ReadMember((MemberReader *)&local_198,&local_170);
      if (!bVar5) {
        return bVar4;
      }
    } while( true );
  }
  data_00._M_str = (char *)plVar2;
  data_00._M_len = uVar1;
  ElfFile::ElfFile(&local_130,data_00);
  if (local_130.ok_ == false) {
    local_170.filename._M_len = (size_t)(file->filename_)._M_dataplus._M_p;
    local_170._0_8_ = (file->filename_)._M_string_length;
    format._M_str = (char *)&local_170;
    format._M_len = (size_t)"Not an ELF or Archive file: $0";
    absl::Substitute_abi_cxx11_(&local_198,(absl *)0x1e,format,in_R8);
    Throw(local_198._M_dataplus._M_p,0x2e2);
  }
  if (local_130.header_.e_machine < 0x15) {
    if (local_130.header_.e_machine < 8) {
      if (local_130.header_.e_machine == 2) {
        *arch = CS_ARCH_SPARC;
        *mode = CS_MODE_BIG_ENDIAN;
        return true;
      }
      if (local_130.header_.e_machine == 3) {
        *arch = CS_ARCH_X86;
        *mode = CS_MODE_32;
        return true;
      }
LAB_001878a4:
      if (verbose_level < 2) {
        return false;
      }
      printf("Unable to map to capstone target, disassembly will be unavailable");
      return false;
    }
    if (local_130.header_.e_machine == 8) {
      *arch = CS_ARCH_MIPS;
      return true;
    }
    if (local_130.header_.e_machine != 0x14) goto LAB_001878a4;
    cVar6 = CS_ARCH_PPC;
LAB_00187845:
    *arch = cVar6;
    *mode = cVar6;
  }
  else {
    if (local_130.header_.e_machine < 0x2b) {
      if (local_130.header_.e_machine != 0x15) {
        if (local_130.header_.e_machine != 0x28) goto LAB_001878a4;
        cVar6 = CS_ARCH_ARM;
        goto LAB_00187845;
      }
      *arch = CS_ARCH_PPC;
    }
    else {
      if (local_130.header_.e_machine == 0x2b) {
        *arch = CS_ARCH_SPARC;
        *mode = CS_MODE_M680X_6801;
        return true;
      }
      if (local_130.header_.e_machine != 0x3e) {
        if (local_130.header_.e_machine == 0xb7) {
          *arch = CS_ARCH_ARM64;
          *mode = CS_MODE_ARM;
          return true;
        }
        goto LAB_001878a4;
      }
      *arch = CS_ARCH_X86;
    }
    *mode = CS_MODE_64;
  }
  return true;
}

Assistant:

static bool ReadElfArchMode(const InputFile& file, cs_arch* arch, cs_mode* mode) {
  bool capstone_available = true;
  ForEachElf(file, nullptr,
             [&capstone_available, arch, mode](const ElfFile& elf,
                                               string_view /*filename*/,
                                               uint32_t /*index_base*/) {
               // Last .o file wins?  (For .a files)?  It's kind of arbitrary,
               // but a single .a file shouldn't have multiple archs in it.
               capstone_available &=
                   ElfMachineToCapstone(elf.header().e_machine, arch, mode);
             });
  return capstone_available;
}